

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O0

Cards * __thiscall
solitaire::piles::TableauPile::tryPullOutCards
          (Cards *__return_storage_ptr__,TableauPile *this,uint quantity)

{
  bool bVar1;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_78;
  const_iterator local_70;
  const_iterator local_68;
  allocator<solitaire::cards::Card> local_49;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_48;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_40;
  undefined1 local_31;
  Card *local_30;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  local_28;
  __normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  firstCardToPullOut;
  uint quantity_local;
  TableauPile *this_local;
  Cards *pulledOutCards;
  
  firstCardToPullOut._M_current._4_4_ = quantity;
  bVar1 = shouldPullOutCards(this,quantity);
  if (bVar1) {
    local_30 = (Card *)std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                       ::end(&this->cards);
    local_40 = std::
               prev<__gnu_cxx::__normal_iterator<solitaire::cards::Card*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>
                         ((__normal_iterator<solitaire::cards::Card_*,_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                           )local_30,(ulong)firstCardToPullOut._M_current._4_4_);
    local_31 = 0;
    local_28 = local_40;
    local_48._M_current =
         (Card *)std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::end
                           (&this->cards);
    std::allocator<solitaire::cards::Card>::allocator(&local_49);
    std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>::
    vector<__gnu_cxx::__normal_iterator<solitaire::cards::Card*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>,void>
              ((vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>> *)
               __return_storage_ptr__,local_40,local_48,&local_49);
    std::allocator<solitaire::cards::Card>::~allocator(&local_49);
    __gnu_cxx::
    __normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
    ::__normal_iterator<solitaire::cards::Card*>
              ((__normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
                *)&local_68,&local_28);
    local_78._M_current =
         (Card *)std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::end
                           (&this->cards);
    __gnu_cxx::
    __normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
    ::__normal_iterator<solitaire::cards::Card*>
              ((__normal_iterator<solitaire::cards::Card_const*,std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
                *)&local_70,&local_78);
    std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::erase
              (&this->cards,local_68,local_70);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Cards TableauPile::tryPullOutCards(unsigned quantity) {
    if (shouldPullOutCards(quantity)) {
        const auto firstCardToPullOut = std::prev(cards.end(), quantity);
        const Cards pulledOutCards {firstCardToPullOut, cards.end()};
        cards.erase(firstCardToPullOut, cards.end());
        return pulledOutCards;
    }

    return Cards {};
}